

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<discordpp::EmbedVideo> * __thiscall
discordpp::field<discordpp::EmbedVideo>::operator=
          (field<discordpp::EmbedVideo> *this,field<discordpp::EmbedVideo> *f)

{
  bool bVar1;
  type pEVar2;
  pointer local_58;
  field<discordpp::EmbedVideo> *f_local;
  field<discordpp::EmbedVideo> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x60);
    pEVar2 = std::unique_ptr<discordpp::EmbedVideo,_std::default_delete<discordpp::EmbedVideo>_>::
             operator*(&f->t_);
    EmbedVideo::EmbedVideo(local_58,pEVar2);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::unique_ptr<discordpp::EmbedVideo,_std::default_delete<discordpp::EmbedVideo>_>::reset
            (&this->t_,local_58);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }